

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

ElementTypeAndOffset * __thiscall
choc::value::Type::getElementTypeAndOffset
          (ElementTypeAndOffset *__return_storage_ptr__,Type *this,uint32_t index)

{
  MainType MVar1;
  
  MVar1 = this->mainType;
  if (MVar1 == object) {
    Object::getElementInfo(__return_storage_ptr__,(this->content).object,index);
  }
  else if (MVar1 == primitiveArray) {
    PrimitiveArray::getElementInfo(__return_storage_ptr__,&(this->content).primitiveArray,index);
  }
  else if (MVar1 == complexArray) {
    ComplexArray::getElementInfo(__return_storage_ptr__,(this->content).complexArray,index);
  }
  else {
    if (MVar1 != vector) {
      throwError("Invalid type");
    }
    Vector::getElementInfo(__return_storage_ptr__,&(this->content).vector,index);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ElementTypeAndOffset Type::getElementTypeAndOffset (uint32_t index) const
{
    if (isType (MainType::vector))          return content.vector.getElementInfo (index);
    if (isType (MainType::primitiveArray))  return content.primitiveArray.getElementInfo (index);
    if (isType (MainType::complexArray))    return content.complexArray->getElementInfo (index);
    if (isType (MainType::object))          return content.object->getElementInfo (index);

    throwError ("Invalid type");
}